

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CameraCalibrationInfo.h
# Opt level: O0

void __thiscall
ViconCGStream::VCameraCalibrationInfo::Write(VCameraCalibrationInfo *this,VBuffer *i_rBuffer)

{
  VBuffer *i_rBuffer_local;
  VCameraCalibrationInfo *this_local;
  
  ViconCGStreamIO::VBuffer::Write<unsigned_int>(i_rBuffer,&this->m_CameraID);
  ViconCGStreamIO::VBuffer::Write<double,3u>(i_rBuffer,&this->m_PoseTranslation);
  ViconCGStreamIO::VBuffer::Write<double,9u>(i_rBuffer,&this->m_PoseRotation);
  ViconCGStreamIO::VBuffer::Write<double,2u>(i_rBuffer,&this->m_PrincipalPoint);
  ViconCGStreamIO::VBuffer::Write<double,2u>(i_rBuffer,&this->m_RadialDistortion);
  ViconCGStreamIO::VBuffer::Write<double>(i_rBuffer,&this->m_FocalLength);
  ViconCGStreamIO::VBuffer::Write<double>(i_rBuffer,&this->m_Skew);
  ViconCGStreamIO::VBuffer::Write<double>(i_rBuffer,&this->m_ImageError);
  return;
}

Assistant:

virtual void Write( ViconCGStreamIO::VBuffer & i_rBuffer ) const
  {
    i_rBuffer.Write( m_CameraID );
    i_rBuffer.Write( m_PoseTranslation );
    i_rBuffer.Write( m_PoseRotation );
    i_rBuffer.Write( m_PrincipalPoint );
    i_rBuffer.Write( m_RadialDistortion );
    i_rBuffer.Write( m_FocalLength );
    i_rBuffer.Write( m_Skew );
    i_rBuffer.Write( m_ImageError );
  }